

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O3

QStringList * __thiscall
QFileSystemComboBoxCompleter::splitPath
          (QStringList *__return_storage_ptr__,QFileSystemComboBoxCompleter *this,QString *path)

{
  long lVar1;
  undefined8 extraout_RAX;
  QDir aQStack_58 [8];
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  QCompleter::model();
  lVar1 = QMetaObject::cast((QObject *)&QFileSystemModel::staticMetaObject);
  if (lVar1 != 0) {
    QFileSystemModel::rootPath();
    QDir::QDir(aQStack_58,(QString *)&local_38);
    QDir::filePath((QString *)&local_50);
    QCompleter::splitPath((QString *)__return_storage_ptr__);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QDir::~QDir(aQStack_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    return __return_storage_ptr__;
  }
  splitPath();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QDir::~QDir(aQStack_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

QStringList splitPath(const QString &path) const override {
        if (const auto model = qobject_cast<QFileSystemModel *>(QCompleter::model())) {
            return QCompleter::splitPath(QDir(model->rootPath()).filePath(path));
        }

        Q_UNREACHABLE();
    }